

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graphics.cpp
# Opt level: O1

void __thiscall RenderTarget::RenderTarget(RenderTarget *this)

{
  (this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->objects).super__Vector_base<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->programs).super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->programs).super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->programs).super__Vector_base<nite::Program,_std::allocator<nite::Program>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clear(this);
  std::vector<nite::Renderable_*,_std::allocator<nite::Renderable_*>_>::reserve
            (&this->objects,0x8000);
  return;
}

Assistant:

RenderTarget(){
		clear();
		objects.reserve(32768);
	}